

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

ostream * el::base::debug::operator<<(ostream *os,StackTrace *st)

{
  pointer pSVar1;
  pointer si;
  
  si = (st->m_stack).
       super__Vector_base<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (si != (st->m_stack).
            super__Vector_base<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"    ",4);
      pSVar1 = si + 1;
      operator<<(os,si);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\n",1);
      si = pSVar1;
    } while (pSVar1 != (st->m_stack).
                       super__Vector_base<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StackTrace& st) {
  std::vector<StackTrace::StackTraceEntry>::const_iterator it = st.m_stack.begin();
  while (it != st.m_stack.end()) {
    os << "    " << *it++ << "\n";
  }
  return os;
}